

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O1

Vec_Ptr_t * Cof_ManCollectHighFanout(Cof_Man_t *p,int nNodes)

{
  Cof_Obj_t *pNode;
  Cof_Obj_t CVar1;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar3 = 8;
  if (6 < nNodes - 1U) {
    iVar3 = nNodes;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar3;
  if (iVar3 == 0) {
    ppvVar2 = (void **)0x0;
  }
  else {
    ppvVar2 = (void **)malloc((long)iVar3 << 3);
  }
  vNodes->pArray = ppvVar2;
  if (0 < p->nObjData) {
    uVar5 = 0;
    do {
      if (p->pObjData == (int *)0x0) {
        return vNodes;
      }
      pNode = (Cof_Obj_t *)(p->pObjData + uVar5);
      CVar1 = *pNode;
      if ((((undefined1  [24])CVar1 & (undefined1  [24])0xf1) == (undefined1  [24])0x1) ||
         (((undefined1  [24])CVar1 & (undefined1  [24])0xf0) != (undefined1  [24])0x0 &&
          ((undefined1  [24])CVar1 & (undefined1  [24])0x1) == (undefined1  [24])0x0)) {
        Cof_ManInsertEntry_rec(vNodes,pNode,nNodes);
      }
      uVar4 = (int)uVar5 + (*(uint *)pNode >> 8) + (*(uint *)pNode >> 4 & 0xf) + 6;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < p->nObjData);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Cof_ManCollectHighFanout( Cof_Man_t * p, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Cof_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( nNodes );
    Cof_ManForEachObj( p, pObj, i )
        if ( Cof_ObjIsCi(pObj) || Cof_ObjIsNode(pObj) )
            Cof_ManInsertEntry_rec( vNodes, pObj, nNodes );
    return vNodes;
}